

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCommentImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMCommentImpl::release(DOMCommentImpl *this)

{
  ushort uVar1;
  int iVar2;
  undefined4 extraout_var;
  DOMException *this_00;
  undefined4 extraout_var_00;
  undefined8 *puVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar3;
  
  uVar1 = (this->fNode).flags;
  if (((uVar1 & 8) == 0) || ((uVar1 & 0x1000) != 0)) {
    iVar2 = (*(this->super_DOMComment).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[0xc])
                      (this);
    lVar3 = CONCAT44(extraout_var,iVar2);
    if (lVar3 != 0) {
      DOMNodeImpl::callUserDataHandlers(&this->fNode,NODE_DELETED,(DOMNode *)0x0,(DOMNode *)0x0);
      DOMCharacterDataImpl::releaseBuffer(&this->fCharacterData);
      (**(code **)(*(long *)(lVar3 + -8) + 0x30))(lVar3 + -8,this,3);
      return;
    }
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar2 = (*(this->super_DOMComment).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[0xc])
                      (this);
    if (CONCAT44(extraout_var_00,iVar2) == 0) {
      puVar4 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*(this->super_DOMComment).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[0xc])
                        (this);
      puVar4 = (undefined8 *)(CONCAT44(extraout_var_02,iVar2) + 0x158);
    }
    DOMException::DOMException(this_00,0xf,0,(MemoryManager *)*puVar4);
  }
  else {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar2 = (*(this->super_DOMComment).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[0xc])
                      (this);
    if (CONCAT44(extraout_var_01,iVar2) == 0) {
      puVar4 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*(this->super_DOMComment).super_DOMCharacterData.super_DOMNode._vptr_DOMNode[0xc])
                        (this);
      puVar4 = (undefined8 *)(CONCAT44(extraout_var_03,iVar2) + 0x158);
    }
    DOMException::DOMException(this_00,0xf,0,(MemoryManager *)*puVar4);
  }
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMCommentImpl::release()
{
    if (fNode.isOwned() && !fNode.isToBeReleased())
        throw DOMException(DOMException::INVALID_ACCESS_ERR,0, GetDOMNodeMemoryManager);

    DOMDocumentImpl* doc = (DOMDocumentImpl*) getOwnerDocument();
    if (doc) {
        fNode.callUserDataHandlers(DOMUserDataHandler::NODE_DELETED, 0, 0);
        fCharacterData.releaseBuffer();
        doc->release(this, DOMMemoryManager::COMMENT_OBJECT);
    }
    else {
        // shouldn't reach here
        throw DOMException(DOMException::INVALID_ACCESS_ERR,0, GetDOMNodeMemoryManager);
    }
}